

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Location * __thiscall
wabt::anon_unknown_67::BinaryReaderIR::GetLocation
          (Location *__return_storage_ptr__,BinaryReaderIR *this)

{
  Location *loc;
  string_view local_20;
  BinaryReaderIR *local_10;
  BinaryReaderIR *this_local;
  
  local_10 = this;
  Location::Location(__return_storage_ptr__);
  string_view::string_view(&local_20,this->filename_);
  (__return_storage_ptr__->filename).data_ = local_20.data_;
  (__return_storage_ptr__->filename).size_ = local_20.size_;
  (__return_storage_ptr__->field_1).field_1.offset =
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  return __return_storage_ptr__;
}

Assistant:

Location BinaryReaderIR::GetLocation() const {
  Location loc;
  loc.filename = filename_;
  loc.offset = state->offset;
  return loc;
}